

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O3

char * xcrypt(char *str,char *buf)

{
  char *pcVar1;
  byte bVar2;
  char *q;
  char *p;
  byte *pbVar3;
  int iVar4;
  byte bVar5;
  
  pcVar1 = buf;
  bVar2 = *str;
  if (bVar2 != 0) {
    pbVar3 = (byte *)(str + 1);
    iVar4 = 1;
    do {
      bVar5 = (byte)iVar4;
      if ((bVar2 & 0x60) == 0) {
        bVar5 = 0;
      }
      *buf = bVar5 ^ bVar2;
      iVar4 = iVar4 * 2;
      if (0x1f < iVar4) {
        iVar4 = 1;
      }
      buf = (char *)((byte *)buf + 1);
      bVar2 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while (bVar2 != 0);
  }
  *buf = 0;
  return pcVar1;
}

Assistant:

char *xcrypt(const char *str, char *buf) /* trivial text encryption routine (see makedefs) */
{
    const char *p;
    char *q;
    int bitmask;

    for (bitmask = 1, p = str, q = buf; *p; q++) {
	*q = *p++;
	if (*q & (32|64)) *q ^= bitmask;
	if ((bitmask <<= 1) >= 32) bitmask = 1;
    }
    *q = '\0';
    return buf;
}